

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaBuild_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew,Vec_Int_t *vMap,Vec_Int_t *vPiMap
                     )

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int i;
  ulong uVar3;
  Gia_Obj_t *pObj_00;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = *(ulong *)pObj;
  if (-1 < (long)uVar5) {
    return;
  }
  uVar3 = uVar5 & 0x7fffffffffffffff;
  *(ulong *)pObj = uVar3;
  if (pObj->Value != 3) {
    __assert_fail("pObj->Value == GIA_UND",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                  ,0xe9,
                  "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  uVar4 = uVar5 & 0x1fffffff;
  if (uVar4 == 0x1fffffff || (int)uVar5 < 0) {
    iVar1 = Gia_ObjIsRo(p,pObj);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Vec_IntEntry(vMap,iVar1);
      if (iVar1 != -1) {
        return;
      }
      __assert_fail("Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xf8,
                    "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ObjIsPi(p,pObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xfe,
                    "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ObjCioId(pObj);
    Vec_IntPush(vPiMap,iVar1);
    i = Gia_ObjId(p,pObj);
    pObj_00 = Gia_ManAppendObj(pNew);
    uVar5 = *(ulong *)pObj_00;
    *(ulong *)pObj_00 = uVar5 | 0x9fffffff;
    *(ulong *)pObj_00 =
         uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
    p_00 = pNew->vCis;
    iVar1 = Gia_ObjId(pNew,pObj_00);
    Vec_IntPush(p_00,iVar1);
    iVar1 = Gia_ObjId(pNew,pObj_00);
    iVar1 = iVar1 * 2;
  }
  else {
    if (pObj[-uVar4].Value == 3) {
      Bmc_MnaBuild_rec(p,pObj + -uVar4,pNew,vMap,vPiMap);
      uVar3 = *(ulong *)pObj;
    }
    uVar5 = (ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff);
    if (pObj[-uVar5].Value == 3) {
      Bmc_MnaBuild_rec(p,pObj + -uVar5,pNew,vMap,vPiMap);
      uVar3 = *(ulong *)pObj;
    }
    iVar2 = 1;
    iVar1 = iVar2;
    if (pObj[-(ulong)((uint)uVar3 & 0x1fffffff)].Value == 3) {
      iVar1 = Gia_ObjFaninId0p(p,pObj);
      iVar1 = Vec_IntEntry(vMap,iVar1);
      iVar1 = Abc_LitNotCond(iVar1,*(uint *)pObj >> 0x1d & 1);
      uVar3 = *(ulong *)pObj;
    }
    if (pObj[-(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)].Value == 3) {
      iVar2 = Gia_ObjId(p,pObj);
      iVar2 = Vec_IntEntry(vMap,iVar2 - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar2 = Abc_LitNotCond(iVar2,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
    }
    i = Gia_ObjId(p,pObj);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
  }
  Vec_IntWriteEntry(vMap,i,iVar1);
  return;
}

Assistant:

void Bmc_MnaBuild_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = 1, iLit1 = 1;
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin1(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            iLit0 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            iLit1 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId1p(p, pObj)), Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManHashAnd(pNew, iLit0, iLit1) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        assert( Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1 );
    else if ( Gia_ObjIsPi(p, pObj) )
    {
        Vec_IntPush( vPiMap, Gia_ObjCioId(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    }
    else assert( 0 );
}